

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bijectionmap.h
# Opt level: O1

iterator __thiscall
Common::
BijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
::insert(BijectionMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
         *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key,KeywordID *val
        )

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *this_00;
  map<ICM::Keyword::KeywordID,_unsigned_long,_std::less<ICM::Keyword::KeywordID>,_std::allocator<std::pair<const_ICM::Keyword::KeywordID,_unsigned_long>_>_>
  *map;
  pointer this_01;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  const_iterator cVar3;
  long lVar4;
  size_t sVar5;
  mapped_type *pmVar6;
  mapped_type mVar7;
  iterator iVar8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>
  local_58;
  
  this_00 = &this->keymap;
  cVar3 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find(&this_00->_M_t,key);
  if ((_Rb_tree_header *)cVar3._M_node == &(this->keymap)._M_t._M_impl.super__Rb_tree_header) {
    lVar4 = ((long)(this->data).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->data).
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  }
  else {
    lVar4 = *(long *)(cVar3._M_node + 2);
  }
  if (lVar4 == ((long)(this->data).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->data).
                      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) {
    map = &this->valmap;
    sVar5 = _find<ICM::Keyword::KeywordID>(this,map,val);
    if (sVar5 == ((long)(this->data).
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->data).
                        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333) {
      pmVar6 = (this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur;
      if ((this->destroyable).super__Deque_base<unsigned_long,_std::allocator<unsigned_long>_>.
          _M_impl.super__Deque_impl_data._M_finish._M_cur == pmVar6) {
        mVar7 = this->currcount;
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::operator[](this_00,key);
        *pmVar6 = mVar7;
        mVar7 = this->currcount;
        pmVar6 = std::
                 map<ICM::Keyword::KeywordID,_unsigned_long,_std::less<ICM::Keyword::KeywordID>,_std::allocator<std::pair<const_ICM::Keyword::KeywordID,_unsigned_long>_>_>
                 ::operator[](map,val);
        *pmVar6 = mVar7;
        paVar1 = &local_58.first.field_2;
        pcVar2 = (key->_M_dataplus)._M_p;
        local_58.first._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,pcVar2,pcVar2 + key->_M_string_length);
        local_58.second = *val;
        std::
        vector<std::pair<std::__cxx11::string,ICM::Keyword::KeywordID>,std::allocator<std::pair<std::__cxx11::string,ICM::Keyword::KeywordID>>>
        ::emplace_back<std::pair<std::__cxx11::string,ICM::Keyword::KeywordID>>
                  ((vector<std::pair<std::__cxx11::string,ICM::Keyword::KeywordID>,std::allocator<std::pair<std::__cxx11::string,ICM::Keyword::KeywordID>>>
                    *)&this->data,&local_58);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_58.first._M_dataplus._M_p,
                          local_58.first.field_2._M_allocated_capacity + 1);
        }
        mVar7 = this->currcount;
        this->currcount = mVar7 + 1;
      }
      else {
        mVar7 = *pmVar6;
        pmVar6 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                 ::operator[](this_00,key);
        *pmVar6 = mVar7;
        pmVar6 = std::
                 map<ICM::Keyword::KeywordID,_unsigned_long,_std::less<ICM::Keyword::KeywordID>,_std::allocator<std::pair<const_ICM::Keyword::KeywordID,_unsigned_long>_>_>
                 ::operator[](map,val);
        *pmVar6 = mVar7;
        paVar1 = &local_58.first.field_2;
        pcVar2 = (key->_M_dataplus)._M_p;
        local_58.first._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,pcVar2,pcVar2 + key->_M_string_length);
        local_58.second = *val;
        this_01 = (this->data).
                  super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>_>
                  ._M_impl.super__Vector_impl_data._M_start + mVar7;
        std::__cxx11::string::operator=((string *)this_01,(string *)&local_58);
        this_01->second = local_58.second;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58.first._M_dataplus._M_p != paVar1) {
          operator_delete(local_58.first._M_dataplus._M_p,
                          local_58.first.field_2._M_allocated_capacity + 1);
        }
        std::deque<unsigned_long,_std::allocator<unsigned_long>_>::pop_front(&this->destroyable);
      }
      goto LAB_0012d89e;
    }
  }
  mVar7 = ((long)(this->data).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->data).
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ICM::Keyword::KeywordID>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
LAB_0012d89e:
  iVar8.count = mVar7;
  iVar8.data = this;
  return iVar8;
}

Assistant:

iterator insert(const _KTy &key, const _VTy &val) {
		if (findKey(key) != size() || findValue(val) != size()) {
			return end();
		}

		iterator result(this);
		if (destroyable.empty()) {
			keymap[key] = currcount;
			valmap[val] = currcount;
			data.push_back(std::make_pair(key, val));
			result = iterator(this, currcount);
			currcount++;
		}
		else {
			size_t id = destroyable.front();
			keymap[key] = id;
			valmap[val] = id;
			data[id] = std::make_pair(key, val);
			result = iterator(this, id);
			destroyable.pop_front();
		}
		return result;
	}